

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptUI(WriteIncludesBase *this,DomUI *node)

{
  DomIncludes *pDVar1;
  DomCustomWidgets *pDVar2;
  DomButtonGroups *pDVar3;
  DomUI *in_RSI;
  DomUI *in_RDI;
  long in_FS_OFFSET;
  char16_t *str_2;
  char16_t *str;
  char16_t *str_1;
  DomUI *ui;
  char16_t *in_stack_ffffffffffffff20;
  TreeWalker *in_stack_ffffffffffffff28;
  QArrayDataPointer<char16_t> local_98 [2];
  DomCustomWidget *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  WriteIncludesBase *in_stack_ffffffffffffffb0;
  QArrayDataPointer<char16_t> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ui = in_RDI;
  QSet<QString>::clear((QSet<QString> *)0x196f88);
  in_RDI->m_has_attr_version = false;
  pDVar1 = DomUI::elementIncludes(in_RSI);
  if (pDVar1 != (DomIncludes *)0x0) {
    pDVar1 = DomUI::elementIncludes(in_RSI);
    (**(code **)&(in_RDI->m_attr_version).d.d[0xc].super_QArrayData)(in_RDI,pDVar1);
  }
  pDVar2 = DomUI::elementCustomWidgets(in_RSI);
  if (pDVar2 != (DomCustomWidgets *)0x0) {
    DomUI::elementCustomWidgets(in_RSI);
    TreeWalker::acceptCustomWidgets
              (in_stack_ffffffffffffff28,(DomCustomWidgets *)in_stack_ffffffffffffff20);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_38,(Data *)0x0,L"QApplication",0xc);
  QString::QString(&in_RSI->m_attr_version,(DataPointer *)in_RDI);
  add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QString::~QString((QString *)0x197055);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff98,(Data *)0x0,L"QVariant",8);
  QString::QString(&in_RSI->m_attr_version,(DataPointer *)in_RDI);
  add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QString::~QString((QString *)0x1970d7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  pDVar3 = DomUI::elementButtonGroups(in_RSI);
  if (pDVar3 != (DomButtonGroups *)0x0) {
    in_stack_ffffffffffffff20 = L"QButtonGroup";
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_98,(Data *)0x0,L"QButtonGroup",0xc);
    QString::QString(&in_RSI->m_attr_version,(DataPointer *)in_RDI);
    add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    QString::~QString((QString *)0x197157);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RSI);
  }
  TreeWalker::acceptUI((TreeWalker *)in_stack_ffffffffffffff20,ui);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptUI(DomUI *node)
{
    m_knownClasses.clear();
    m_laidOut = false;

    if (node->elementIncludes())
        acceptIncludes(node->elementIncludes());

    // Populate known custom widgets first
    if (node->elementCustomWidgets())
        TreeWalker::acceptCustomWidgets(node->elementCustomWidgets());

    add(QStringLiteral("QApplication"));
    add(QStringLiteral("QVariant"));

    if (node->elementButtonGroups())
        add(QStringLiteral("QButtonGroup"));

    TreeWalker::acceptUI(node);
}